

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

Model * readinstance(Model *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Reader reader;
  string local_4f0;
  Reader local_4d0;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f0,pcVar1,pcVar1 + filename->_M_string_length);
  Reader::Reader(&local_4d0,&local_4f0);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  Reader::read((Reader *)__return_storage_ptr__,(int)&local_4d0,__buf,in_RCX);
  Reader::~Reader(&local_4d0);
  return __return_storage_ptr__;
}

Assistant:

Model readinstance(std::string filename) {
  Reader reader(filename);
  return reader.read();
}